

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSymm.c
# Opt level: O2

void Abc_NtkSymmetries(Abc_Ntk_t *pNtk,int fUseBdds,int fNaive,int fReorder,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  abctime aVar7;
  DdManager *unique;
  abctime aVar8;
  abctime aVar9;
  Abc_Obj_t *pObj;
  int *piVar10;
  void *pvVar11;
  undefined8 uVar12;
  Extra_SymmInfo_t *p;
  char *pcVar13;
  char **__ptr;
  abctime aVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  DdNode *f;
  ulong uVar19;
  uint local_88;
  
  if (fUseBdds == 0 && fNaive == 0) {
    uVar5 = Sim_ComputeTwoVarSymms(pNtk,fVerbose);
    printf("The total number of symmetries is %d.\n",(ulong)uVar5);
    return;
  }
  aVar7 = Abc_Clock();
  unique = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,fReorder,0,fVerbose);
  uVar5 = Abc_NtkSizeOfGlobalBdds(pNtk);
  printf("Shared BDD size = %d nodes.\n",(ulong)uVar5);
  Cudd_AutodynDisable(unique);
  Cudd_zddVarsFromBddVars(unique,2);
  aVar8 = Abc_Clock();
  aVar9 = Abc_Clock();
  local_88 = 0;
  iVar6 = 0;
  while( true ) {
    if (pNtk->vCos->nSize <= iVar6) {
      printf("Total number of vars in functional supports = %8d.\n");
      printf("Total number of two-variable symmetries     = %8d.\n",(ulong)local_88);
      aVar14 = Abc_Clock();
      Abc_NtkFreeGlobalBdds(pNtk,1);
      puts("Statistics of BDD-based symmetry detection:");
      pcVar13 = "naive";
      if (fNaive == 0) {
        pcVar13 = "fast";
      }
      pcVar15 = "no";
      if (fReorder != 0) {
        pcVar15 = "yes";
      }
      iVar6 = 0x7adafc;
      printf("Algorithm = %s. Reordering = %s. Garbage collection = %s.\n",pcVar13,pcVar15);
      Abc_Print(iVar6,"%s =","Constructing BDDs");
      Abc_Print(iVar6,"%9.2f sec\n",(double)(aVar8 - aVar7) / 1000000.0);
      Abc_Print(iVar6,"%s =","Computing symms  ");
      Abc_Print(iVar6,"%9.2f sec\n",(double)(aVar14 - aVar9) / 1000000.0);
      Abc_Print(iVar6,"%s =","TOTAL            ");
      Abc_Print(iVar6,"%9.2f sec\n",(double)((aVar14 - aVar9) + (aVar8 - aVar7)) / 1000000.0);
      return;
    }
    pObj = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vCos,iVar6);
    piVar10 = (int *)Vec_PtrEntry(pObj->pNtk->vAttrs,7);
    pvVar11 = *(void **)(piVar10 + 2);
    if (pvVar11 == (void *)0x0) break;
    iVar1 = pObj->Id;
    lVar16 = (long)iVar1;
    iVar2 = *piVar10;
    if (iVar2 <= iVar1) {
      iVar3 = iVar1 + 10;
      if (iVar1 < iVar2 * 2) {
        iVar3 = iVar2 * 2;
      }
      if (iVar2 < iVar3) {
        pvVar11 = realloc(pvVar11,(long)iVar3 * 8);
        *(void **)(piVar10 + 2) = pvVar11;
        memset((void *)((long)*piVar10 * 8 + (long)pvVar11),0,((long)iVar3 - (long)*piVar10) * 8);
        *piVar10 = iVar3;
      }
    }
    f = *(DdNode **)((long)pvVar11 + lVar16 * 8);
    if (f == (DdNode *)0x0) {
      if (*(code **)(piVar10 + 8) == (code *)0x0) {
        f = (DdNode *)0x0;
      }
      else {
        uVar12 = (**(code **)(piVar10 + 8))(*(undefined8 *)(piVar10 + 4));
        *(undefined8 *)(*(long *)(piVar10 + 2) + lVar16 * 8) = uVar12;
        f = *(DdNode **)(*(long *)(piVar10 + 2) + lVar16 * 8);
      }
    }
    Cudd_SupportSize(unique,f);
    if (*(int *)((ulong)f & 0xfffffffffffffffe) != 0x7fffffff) {
      if (fNaive == 0) {
        p = Extra_SymmPairsCompute(unique,f);
      }
      else {
        p = Extra_SymmPairsComputeNaive(unique,f);
      }
      local_88 = local_88 + p->nSymms;
      if (fVerbose != 0) {
        pcVar13 = Abc_ObjName(pObj);
        printf("Output %6s (%d): ",pcVar13,(ulong)(uint)p->nSymms);
        iVar1 = pNtk->vCis->nSize;
        __ptr = Abc_NtkCollectCioNames(pNtk,0);
        pvVar11 = calloc(1,(long)iVar1 << 2);
        uVar5 = p->nVars;
        uVar19 = 0;
        if (0 < (int)uVar5) {
          uVar19 = (ulong)uVar5;
        }
        for (uVar17 = 0; uVar17 != uVar19; uVar17 = uVar17 + 1) {
          if (*(int *)((long)pvVar11 + uVar17 * 4) == 0) {
            bVar4 = true;
            for (uVar18 = 0; uVar5 != uVar18; uVar18 = uVar18 + 1) {
              if ((uVar17 != uVar18) && (p->pSymms[uVar17][uVar18] != '\0')) {
                if (*(int *)((long)pvVar11 + uVar18 * 4) != 0) {
                  __assert_fail("pVarTaken[k] == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSymm.c"
                                ,0xd3,"void Ntk_NetworkSymmsPrint(Abc_Ntk_t *, Extra_SymmInfo_t *)")
                  ;
                }
                if (bVar4) {
                  printf("  { %s",__ptr[p->pVars[uVar17]]);
                  *(undefined4 *)((long)pvVar11 + uVar17 * 4) = 1;
                }
                bVar4 = false;
                printf(" %s",__ptr[p->pVars[uVar18]]);
                *(undefined4 *)((long)pvVar11 + uVar18 * 4) = 1;
              }
            }
            if (!bVar4) {
              printf(" }");
            }
          }
        }
        putchar(10);
        free(__ptr);
        free(pvVar11);
      }
      Extra_SymmPairsDissolve(p);
    }
    iVar6 = iVar6 + 1;
  }
  __assert_fail("p->pArrayPtr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
}

Assistant:

void Abc_NtkSymmetries( Abc_Ntk_t * pNtk, int fUseBdds, int fNaive, int fReorder, int fVerbose )
{
    if ( fUseBdds || fNaive )
        Abc_NtkSymmetriesUsingBdds( pNtk, fNaive, fReorder, fVerbose );
    else
        Abc_NtkSymmetriesUsingSandS( pNtk, fVerbose );
}